

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

bstrList * bsplits(const_bstring str,const_bstring splitStr)

{
  int iVar1;
  bstrList *__ptr;
  bstring *pptVar2;
  genBstrList g;
  
  if (str == (const_bstring)0x0) {
    return (bstrList *)0x0;
  }
  if (-1 < str->slen) {
    if (splitStr == (const_bstring)0x0) {
      return (bstrList *)0x0;
    }
    if (str->data == (uchar *)0x0) {
      return (bstrList *)0x0;
    }
    if (((-1 < splitStr->slen) && (splitStr->data != (uchar *)0x0)) &&
       (__ptr = (bstrList *)malloc(0x10), __ptr != (bstrList *)0x0)) {
      __ptr->mlen = 4;
      g.bl = __ptr;
      pptVar2 = (bstring *)malloc(0x20);
      __ptr->entry = pptVar2;
      if (pptVar2 == (bstring *)0x0) {
        free(__ptr);
      }
      else {
        __ptr->qty = 0;
        g.b = str;
        iVar1 = bsplitscb(str,splitStr,0,bscb,&g);
        if (-1 < iVar1) {
          return g.bl;
        }
        bstrListDestroy(g.bl);
      }
    }
  }
  return (bstrList *)0x0;
}

Assistant:

struct bstrList * bsplits (const_bstring str, const_bstring splitStr) {
struct genBstrList g;

	if (     str == NULL ||      str->slen < 0 ||      str->data == NULL ||
	    splitStr == NULL || splitStr->slen < 0 || splitStr->data == NULL)
		return NULL;

	g.bl = (struct bstrList *) bstr__alloc (sizeof (struct bstrList));
	if (g.bl == NULL) return NULL;
	g.bl->mlen = 4;
	g.bl->entry = (bstring *) bstr__alloc (g.bl->mlen * sizeof (bstring));
	if (NULL == g.bl->entry) {
		bstr__free (g.bl);
		return NULL;
	}
	g.b = (bstring) str;
	g.bl->qty = 0;

	if (bsplitscb (str, splitStr, 0, bscb, &g) < 0) {
		bstrListDestroy (g.bl);
		return NULL;
	}
	return g.bl;
}